

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_SG(DisasContext_conflict1 *s,arg_SG *a)

{
  int iVar1;
  arg_SG *a_local;
  DisasContext_conflict1 *s_local;
  
  iVar1 = arm_dc_feature(s,9);
  if ((iVar1 != 0) && (iVar1 = arm_dc_feature(s,0x1b), iVar1 != 0)) {
    if ((s->v8m_secure & 1U) != 0) {
      s->condexec_cond = 0;
      s->condexec_mask = 0;
    }
    return true;
  }
  return false;
}

Assistant:

static bool trans_SG(DisasContext *s, arg_SG *a)
{
    if (!arm_dc_feature(s, ARM_FEATURE_M) ||
        !arm_dc_feature(s, ARM_FEATURE_V8)) {
        return false;
    }
    /*
     * SG (v8M only)
     * The bulk of the behaviour for this instruction is implemented
     * in v7m_handle_execute_nsc(), which deals with the insn when
     * it is executed by a CPU in non-secure state from memory
     * which is Secure & NonSecure-Callable.
     * Here we only need to handle the remaining cases:
     *  * in NS memory (including the "security extension not
     *    implemented" case) : NOP
     *  * in S memory but CPU already secure (clear IT bits)
     * We know that the attribute for the memory this insn is
     * in must match the current CPU state, because otherwise
     * get_phys_addr_pmsav8 would have generated an exception.
     */
    if (s->v8m_secure) {
        /* Like the IT insn, we don't need to generate any code */
        s->condexec_cond = 0;
        s->condexec_mask = 0;
    }
    return true;
}